

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

aiVector2D __thiscall Assimp::XGLImporter::ReadVec2(XGLImporter *this)

{
  Assimp AVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Assimp *this_00;
  Assimp *pAVar4;
  ulong uVar5;
  long lVar6;
  ai_real v [2];
  float local_2c;
  aiVector2D local_28;
  
  bVar2 = SkipToText(this);
  if (bVar2) {
    iVar3 = (*((this->m_reader).
               super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->_vptr_IIrrXMLReader[0xe])();
    this_00 = (Assimp *)CONCAT44(extraout_var,iVar3);
    lVar6 = 0;
LAB_005e5597:
    do {
      uVar5 = (ulong)(byte)*this_00;
      if (uVar5 < 0x21) {
        if ((0x100000200U >> (uVar5 & 0x3f) & 1) != 0) {
          this_00 = this_00 + 1;
          goto LAB_005e5597;
        }
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_005e5616;
      }
      local_2c = 0.0;
      pAVar4 = (Assimp *)
               fast_atoreal_move<float>(this_00,(char *)&local_2c,(float *)0x1,(bool)*this_00);
      (&local_28.x)[lVar6] = local_2c;
      do {
        do {
          this_00 = pAVar4 + 1;
          AVar1 = *pAVar4;
          pAVar4 = this_00;
        } while (AVar1 == (Assimp)0x20);
      } while (AVar1 == (Assimp)0x9);
      if ((lVar6 != 1) && (AVar1 != (Assimp)0x2c)) goto LAB_005e5616;
      bVar2 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar2);
  }
  else {
LAB_005e5616:
    LogFunctions<Assimp::XGLImporter>::LogError((char *)0x5e561b);
    local_28.x = 0.0;
    local_28.y = 0.0;
  }
  return local_28;
}

Assistant:

aiVector2D XGLImporter::ReadVec2()
{
    aiVector2D vec;

    if(!SkipToText()) {
        LogError("unexpected EOF reading vec2 contents");
        return vec;
    }
    const char* s = m_reader->getNodeData();

    ai_real v[2];
	for(int i = 0; i < 2; ++i) {
        if(!SkipSpaces(&s)) {
            LogError("unexpected EOL, failed to parse vec2");
            return vec;
        }
		
        v[i] = fast_atof(&s);

        SkipSpaces(&s);
        if (i != 1 && *s != ',') {
            LogError("expected comma, failed to parse vec2");
            return vec;
        }
        ++s;
    }
	vec.x = v[0];
	vec.y = v[1];

    return vec;
}